

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::EmitAddtlInfo_SnapPromiseInfo(SnapObject *snpObject,FileWriter *writer)

{
  SnapPromiseInfo *pSVar1;
  uint local_2c;
  Separator sep_1;
  uint32 i_1;
  Separator sep;
  uint32 i;
  SnapPromiseInfo *promiseInfo;
  FileWriter *writer_local;
  SnapObject *snpObject_local;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseInfo*,(TTD::NSSnapObjects::SnapObjectType)28>
                     (snpObject);
  FileWriter::WriteUInt32(writer,u32Val,pSVar1->Status,CommaSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)(pSVar1->isHandled & 1),1);
  (*writer->_vptr_FileWriter[3])(writer,6,1);
  NSSnapValues::EmitTTDVar(pSVar1->Result,writer,NoSeparator);
  FileWriter::WriteLengthValue(writer,pSVar1->ResolveReactionCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  for (i_1 = 0; i_1 < pSVar1->ResolveReactionCount; i_1 = i_1 + 1) {
    NSSnapValues::EmitPromiseReactionInfo(pSVar1->ResolveReactions + i_1,writer,i_1 != 0);
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  FileWriter::WriteLengthValue(writer,pSVar1->RejectReactionCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  for (local_2c = 0; local_2c < pSVar1->RejectReactionCount; local_2c = local_2c + 1) {
    NSSnapValues::EmitPromiseReactionInfo(pSVar1->RejectReactions + local_2c,writer,local_2c != 0);
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  return;
}

Assistant:

void EmitAddtlInfo_SnapPromiseInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapPromiseInfo* promiseInfo = SnapObjectGetAddtlInfoAs<SnapPromiseInfo*, SnapObjectType::SnapPromiseObject>(snpObject);

            writer->WriteUInt32(NSTokens::Key::u32Val, promiseInfo->Status, NSTokens::Separator::CommaSeparator);
            writer->WriteBool(NSTokens::Key::boolVal, promiseInfo->isHandled, NSTokens::Separator::CommaSeparator);

            writer->WriteKey(NSTokens::Key::resultValue, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(promiseInfo->Result, writer, NSTokens::Separator::NoSeparator);

            writer->WriteLengthValue(promiseInfo->ResolveReactionCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < promiseInfo->ResolveReactionCount; ++i)
            {
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;
                NSSnapValues::EmitPromiseReactionInfo(promiseInfo->ResolveReactions + i, writer, sep);
            }
            writer->WriteSequenceEnd();

            writer->WriteLengthValue(promiseInfo->RejectReactionCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < promiseInfo->RejectReactionCount; ++i)
            {
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;
                NSSnapValues::EmitPromiseReactionInfo(promiseInfo->RejectReactions + i, writer, sep);
            }
            writer->WriteSequenceEnd();
        }